

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Gia_Ga2SendAbsracted(Ga2_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Int_t *local_28;
  Vec_Int_t *vGateClasses;
  Gia_Man_t *pAbs;
  Ga2_Man_t *pGStack_10;
  int fVerbose_local;
  Ga2_Man_t *p_local;
  
  pAbs._4_4_ = fVerbose;
  pGStack_10 = p;
  iVar1 = Abc_FrameIsBridgeMode();
  if (iVar1 != 0) {
    local_28 = Ga2_ManAbsTranslate(pGStack_10);
    vGateClasses = (Vec_Int_t *)Gia_ManDupAbsGates(pGStack_10->pGia,local_28);
    Vec_IntFreeP(&local_28);
    Gia_ManCleanValue(pGStack_10->pGia);
    Gia_ManToBridgeAbsNetlist(_stdout,vGateClasses,0x6b);
    Gia_ManStop((Gia_Man_t *)vGateClasses);
    return;
  }
  __assert_fail("Abc_FrameIsBridgeMode()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                ,0x5bc,"void Gia_Ga2SendAbsracted(Ga2_Man_t *, int)");
}

Assistant:

void Gia_Ga2SendAbsracted( Ga2_Man_t * p, int fVerbose )
{
    Gia_Man_t * pAbs;
    Vec_Int_t * vGateClasses;
    assert( Abc_FrameIsBridgeMode() );
//    if ( fVerbose )
//        Abc_Print( 1, "Sending abstracted model...\n" );
    // create abstraction (value of p->pGia is not used here)
    vGateClasses = Ga2_ManAbsTranslate( p );
    pAbs = Gia_ManDupAbsGates( p->pGia, vGateClasses );
    Vec_IntFreeP( &vGateClasses );
    Gia_ManCleanValue( p->pGia );
    // send it out
    Gia_ManToBridgeAbsNetlist( stdout, pAbs, BRIDGE_ABS_NETLIST );
    Gia_ManStop( pAbs );
}